

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O1

void __thiscall QPDFWriter::generateObjectStreams(QPDFWriter *this)

{
  element_type *peVar1;
  long lVar2;
  int iVar3;
  Object *pOVar4;
  ulong uVar5;
  ulong uVar6;
  ulong idx;
  QPDFObjGen *item;
  ulong uVar7;
  pointer pQVar8;
  int iVar9;
  ulong uVar10;
  vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> eligible;
  QPDFObjectHandle QStack_58;
  vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> local_48;
  
  QPDF::getCompressibleObjVector
            (&local_48,
             ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pdf);
  uVar7 = ((long)local_48.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_48.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) + 99;
  uVar10 = uVar7 / 100;
  initializeTables(this,uVar10 * 2);
  if (uVar7 < 100) {
    (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->obj).
    streams_empty = true;
  }
  else {
    uVar5 = (long)local_48.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_48.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    uVar7 = uVar5 / uVar10;
    QPDF::newIndirectNull((QPDF *)&QStack_58);
    iVar3 = QPDFObjectHandle::getObjectID(&QStack_58);
    if (QStack_58.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (QStack_58.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_48.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_48.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar6 = 0;
      pQVar8 = local_48.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        iVar9 = (int)uVar6;
        if (uVar7 + (uVar10 * uVar7 < uVar5) == uVar6) {
          QPDF::newIndirectNull((QPDF *)&QStack_58);
          iVar3 = QPDFObjectHandle::getObjectID(&QStack_58);
          if (QStack_58.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (QStack_58.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          iVar9 = 0;
        }
        peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        idx = (ulong)pQVar8->obj;
        lVar2 = *(long *)&(peVar1->obj).super_ObjTable<QPDFWriter::Object>.
                          super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
                          super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                          ._M_impl;
        uVar6 = ((long)*(pointer *)
                        ((long)&(peVar1->obj).super_ObjTable<QPDFWriter::Object>.
                                super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                                .
                                super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                        + 8) - lVar2 >> 2) * -0x5555555555555555;
        if (uVar6 < idx || uVar6 - idx == 0) {
          pOVar4 = ObjTable<QPDFWriter::Object>::large_element
                             (&(peVar1->obj).super_ObjTable<QPDFWriter::Object>,idx);
        }
        else {
          pOVar4 = (Object *)(lVar2 + idx * 0xc);
        }
        pOVar4->object_stream = iVar3;
        pOVar4->gen = pQVar8->gen;
        uVar6 = (ulong)(iVar9 + 1);
        pQVar8 = pQVar8 + 1;
      } while (pQVar8 != local_48.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
    }
  }
  if (local_48.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
QPDFWriter::generateObjectStreams()
{
    // Basic strategy: make a list of objects that can go into an object stream.  Then figure out
    // how many object streams are needed so that we can distribute objects approximately evenly
    // without having any object stream exceed 100 members.  We don't have to worry about linearized
    // files here -- if the file is linearized, we take care of excluding things that aren't allowed
    // here later.

    // This code doesn't do anything with /Extends.

    std::vector<QPDFObjGen> eligible = QPDF::Writer::getCompressibleObjGens(m->pdf);
    size_t n_object_streams = (eligible.size() + 99U) / 100U;

    initializeTables(2U * n_object_streams);
    if (n_object_streams == 0) {
        m->obj.streams_empty = true;
        return;
    }
    size_t n_per = eligible.size() / n_object_streams;
    if (n_per * n_object_streams < eligible.size()) {
        ++n_per;
    }
    unsigned int n = 0;
    int cur_ostream = m->pdf.newIndirectNull().getObjectID();
    for (auto const& item: eligible) {
        if (n == n_per) {
            QTC::TC("qpdf", "QPDFWriter generate >1 ostream");
            n = 0;
            // Construct a new null object as the "original" object stream.  The rest of the code
            // knows that this means we're creating the object stream from scratch.
            cur_ostream = m->pdf.newIndirectNull().getObjectID();
        }
        auto& obj = m->obj[item];
        obj.object_stream = cur_ostream;
        obj.gen = item.getGen();
        ++n;
    }
}